

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O3

void __thiscall
TEST_JUnitOutputTest_withOneTestGroupAndOneTestOutputsValidXMLFiles_Test::testBody
          (TEST_JUnitOutputTest_withOneTestGroupAndOneTestOutputsValidXMLFiles_Test *this)

{
  JUnitTestOutputTestRunner *pJVar1;
  FileForJUnitOutputTests *pFVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  
  pJVar1 = (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).testCaseRunner;
  TestResult::testsStarted(&pJVar1->result_);
  JUnitTestOutputTestRunner::runPreviousTest(pJVar1);
  JUnitTestOutputTestRunner::endOfPreviousTestGroup(pJVar1);
  pJVar1->currentGroupName_ = "groupname";
  pJVar1 = JUnitTestOutputTestRunner::withTest(pJVar1,"testname");
  JUnitTestOutputTestRunner::end(pJVar1);
  pFVar2 = FileSystemForJUnitTestOutputTests::file(&fileSystem,"cpputest_groupname.xml");
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).outputFile = pFVar2;
  pUVar3 = UtestShell::getCurrent();
  pcVar4 = FileForJUnitOutputTests::line
                     ((this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).outputFile,1);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,"<?xml version=\"1.0\" encoding=\"UTF-8\" ?>\n",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
             ,0x181,pTVar5);
  return;
}

Assistant:

TEST(JUnitOutputTest, withOneTestGroupAndOneTestOutputsValidXMLFiles)
{
    testCaseRunner->start()
            .withGroup("groupname").withTest("testname")
            .end();

    outputFile = fileSystem.file("cpputest_groupname.xml");
    STRCMP_EQUAL("<?xml version=\"1.0\" encoding=\"UTF-8\" ?>\n", outputFile->line(1));
}